

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_sauf_background.h
# Opt level: O2

void __thiscall SAUF_BG<TTA>::PerformLabeling(SAUF_BG<TTA> *this)

{
  uint uVar1;
  int iVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  uint *puVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  int r;
  long lVar9;
  long lVar10;
  uint v;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  Size local_98;
  Mat local_90 [96];
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_;
  uVar6 = *(uint *)&pMVar3->field_0x8;
  uVar1 = *(uint *)&pMVar3->field_0xc;
  local_98.height = (int)**(undefined8 **)&pMVar3->field_0x40;
  local_98.width = (int)((ulong)**(undefined8 **)&pMVar3->field_0x40 >> 0x20);
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_;
  TTA::Alloc((int)((long)*(int *)&pMVar3->field_0xc + 1U >> 1) * (*(int *)&pMVar3->field_0x8 + 1) +
             1);
  *TTA::rtable_ = 0;
  uVar16 = 0;
  uVar11 = 0;
  if (0 < (int)uVar1) {
    uVar11 = (ulong)uVar1;
  }
  uVar14 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar14 = uVar16;
  }
  TTA::length_ = 1;
  lVar12 = -1;
  do {
    if (uVar16 == uVar14) {
      uVar6 = TTA::Flatten();
      (this->super_Labeling2D<(Connectivity2D)8,_true>).n_labels_ = uVar6;
      pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_;
      for (lVar12 = 0; puVar5 = TTA::rtable_, lVar12 < *(int *)&pMVar4->field_0x8;
          lVar12 = lVar12 + 1) {
        lVar7 = **(long **)&pMVar4->field_0x48 * lVar12 + *(long *)&pMVar4->field_0x10;
        iVar2 = *(int *)&pMVar4->field_0xc;
        for (lVar13 = 0; (long)iVar2 * 4 != lVar13; lVar13 = lVar13 + 4) {
          *(uint *)(lVar7 + lVar13) = puVar5[*(uint *)(lVar7 + lVar13)];
        }
      }
      TTA::Dealloc();
      return;
    }
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_;
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_;
    lVar7 = *(long *)&pMVar3->field_0x10;
    lVar13 = **(long **)&pMVar3->field_0x48;
    lVar17 = lVar13 * uVar16 + lVar7;
    lVar9 = *(long *)&pMVar4->field_0x10;
    lVar15 = **(long **)&pMVar4->field_0x48;
    lVar10 = lVar15 * uVar16 + lVar9;
    lVar9 = lVar15 * lVar12 + lVar9;
    lVar7 = lVar13 * lVar12 + lVar7;
    lVar15 = 0;
    lVar13 = -1;
    while (lVar13 - uVar11 != -1) {
      if (*(char *)(lVar17 + 1 + lVar13) == '\0') {
        if ((uVar16 != 0) && (*(char *)(lVar7 + 1 + lVar13) == '\0')) {
          if ((lVar13 == -1) || (*(char *)(lVar17 + lVar13) != '\0')) goto LAB_001eaa8f;
          uVar6 = *(uint *)(lVar9 + 4 + lVar13 * 4);
          v = *(uint *)(lVar10 + lVar13 * 4);
LAB_001eab7d:
          uVar6 = TTA::Merge(uVar6,v);
          goto LAB_001eab32;
        }
        if ((lVar13 != -1) && (*(char *)(lVar17 + lVar13) == '\0')) {
          uVar6 = *(uint *)(lVar10 + lVar13 * 4);
          goto LAB_001eab32;
        }
LAB_001eab28:
        uVar6 = TTA::NewLabel();
      }
      else {
        if (uVar16 == 0) {
          lVar8 = lVar13;
          if (lVar13 != -1) {
LAB_001eaacb:
            if (*(char *)(lVar17 + lVar8) != '\0') {
              uVar6 = *(uint *)(lVar10 + lVar8 * 4);
              goto LAB_001eab32;
            }
          }
          goto LAB_001eab28;
        }
        if (*(char *)(lVar7 + 1 + lVar13) == '\0') {
          if (((long)(int)uVar1 + -1 <= lVar13 + 1) || (*(char *)(lVar7 + 2 + lVar13) == '\0')) {
            if (lVar13 != -1) {
              if (*(char *)(lVar7 + lVar13) != '\0') {
                uVar6 = *(uint *)(lVar9 + lVar13 * 4);
                goto LAB_001eab32;
              }
              lVar8 = lVar15 + -1;
              goto LAB_001eaacb;
            }
            goto LAB_001eab28;
          }
          if (lVar13 != -1) {
            if (*(char *)(lVar7 + lVar13) == '\0') {
              if (*(char *)(lVar17 + lVar13) == '\0') goto LAB_001eab84;
              uVar6 = *(uint *)(lVar10 + lVar13 * 4);
            }
            else {
              uVar6 = *(uint *)(lVar9 + lVar13 * 4);
            }
            v = *(uint *)(lVar9 + 8 + lVar13 * 4);
            goto LAB_001eab7d;
          }
LAB_001eab84:
          uVar6 = *(uint *)(lVar9 + 8 + lVar13 * 4);
        }
        else {
LAB_001eaa8f:
          uVar6 = *(uint *)(lVar9 + 4 + lVar13 * 4);
        }
      }
LAB_001eab32:
      *(uint *)(lVar10 + 4 + lVar13 * 4) = uVar6;
      lVar15 = lVar15 + 1;
      lVar13 = lVar13 + 1;
    }
    uVar16 = uVar16 + 1;
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size()); // Allocation + initialization of the output image

        LabelsSolver::Alloc((size_t)img_.rows * (((size_t)img_.cols + 1) / 2) + ((size_t)img_.cols + 1) / 2 + 1); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First scan
        for (int r = 0; r < h; ++r) {
            // Get row pointers
            unsigned char const* const img_row = img_.ptr<unsigned char>(r);
            unsigned char const* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
            unsigned* const  img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const  img_labels_row_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; ++c) {
#define CONDITION_P c > 0 && r > 0 && img_row_prev[c - 1] > 0
#define CONDITION_Q r > 0 && img_row_prev[c] > 0
#define CONDITION_R c < w - 1 && r > 0 && img_row_prev[c + 1] > 0
#define CONDITION_S c > 0 && img_row[c - 1] > 0
#define CONDITION_X img_row[c] > 0
#define CONDITION_Q_BG r > 0 && img_row_prev[c] == 0
#define CONDITION_S_BG c > 0 && img_row[c - 1] == 0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c], img_labels_row[c - 1]); // x <- p + s

#include "labeling_sauf_bg_tree.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r = 0; r < img_labels_.rows; ++r) {
            unsigned* img_row_start = img_labels_.ptr<unsigned>(r);
            unsigned* const img_row_end = img_row_start + img_labels_.cols;
            for (; img_row_start != img_row_end; ++img_row_start) {
                *img_row_start = LabelsSolver::GetLabel(*img_row_start);
            }
        }

        LabelsSolver::Dealloc(); // Memory deallocation of the labels solver

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
#undef CONDITION_Q_BG
#undef CONDITION_S_BG
    }